

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O3

bool __thiscall crnlib::dynamic_stream::seek(dynamic_stream *this,int64 ofs,bool relative)

{
  byte bVar1;
  ulong uVar2;
  
  bVar1 = (this->super_data_stream).field_0x1a;
  if (((bVar1 & 1) != 0) && (((this->super_data_stream).m_attribs & 4) != 0)) {
    uVar2 = (ulong)this->m_ofs;
    if (!relative) {
      uVar2 = 0;
    }
    uVar2 = uVar2 + ofs;
    if ((-1 < (long)uVar2) && (uVar2 <= (this->m_buf).m_size)) {
      this->m_ofs = (uint)uVar2;
      (this->super_data_stream).field_0x1a = bVar1 & 0xfb;
      return true;
    }
  }
  return false;
}

Assistant:

virtual bool seek(int64 ofs, bool relative)
        {
            if ((!m_opened) || (!is_seekable()))
            {
                return false;
            }

            int64 new_ofs = relative ? (m_ofs + ofs) : ofs;

            if (new_ofs < 0)
            {
                return false;
            }
            else if (new_ofs > m_buf.size())
            {
                return false;
            }

            m_ofs = static_cast<uint>(new_ofs);

            post_seek();

            return true;
        }